

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O0

WallTimer __thiscall
miniros::NodeHandle::createWallTimer
          (NodeHandle *this,WallDuration *period,WallTimerCallback *callback,bool oneshot,
          bool autostart)

{
  WallTimerOptions *in_RCX;
  NodeHandle *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  WallTimerOptions *in_RSI;
  element_type *in_RDI;
  WallTimer WVar1;
  WallTimerOptions ops;
  
  WallTimerOptions::WallTimerOptions(in_RCX);
  std::function<void_(const_miniros::WallTimerEvent_&)>::operator=
            ((function<void_(const_miniros::WallTimerEvent_&)> *)in_RSI,
             (function<void_(const_miniros::WallTimerEvent_&)> *)in_RDI);
  createWallTimer(in_RDX,in_RSI);
  WallTimerOptions::~WallTimerOptions(in_RCX);
  WVar1.impl_.super___shared_ptr<miniros::WallTimer::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  WVar1.impl_.super___shared_ptr<miniros::WallTimer::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (WallTimer)
         WVar1.impl_.super___shared_ptr<miniros::WallTimer::Impl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

WallTimer NodeHandle::createWallTimer(WallDuration period, const WallTimerCallback& callback, 
                                      bool oneshot, bool autostart) const
{
  WallTimerOptions ops;
  ops.period = period;
  ops.callback = callback;
  ops.oneshot = oneshot;
  ops.autostart = autostart;
  return createWallTimer(ops);
}